

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

int mbedtls_ecdh_compute_shared
              (mbedtls_ecp_group *grp,mbedtls_mpi *z,mbedtls_ecp_point *Q,mbedtls_mpi *d,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_mpi *d_local;
  mbedtls_ecp_point *Q_local;
  mbedtls_mpi *z_local;
  mbedtls_ecp_group *grp_local;
  
  iVar1 = ecdh_compute_shared_restartable(grp,z,Q,d,f_rng,p_rng,(mbedtls_ecp_restart_ctx *)0x0);
  return iVar1;
}

Assistant:

int mbedtls_ecdh_compute_shared( mbedtls_ecp_group *grp, mbedtls_mpi *z,
                         const mbedtls_ecp_point *Q, const mbedtls_mpi *d,
                         int (*f_rng)(void *, unsigned char *, size_t),
                         void *p_rng )
{
    ECDH_VALIDATE_RET( grp != NULL );
    ECDH_VALIDATE_RET( Q != NULL );
    ECDH_VALIDATE_RET( d != NULL );
    ECDH_VALIDATE_RET( z != NULL );
    return( ecdh_compute_shared_restartable( grp, z, Q, d,
                                             f_rng, p_rng, NULL ) );
}